

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O2

void Image_Function::RgbToBgr
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  undefined4 in_register_00000034;
  uchar *puVar4;
  uchar *puVar5;
  undefined4 in_register_00000084;
  ulong uVar6;
  uchar *puVar7;
  uint local_94;
  undefined8 local_90;
  undefined8 local_88;
  ImageTemplate<unsigned_char> local_80;
  ImageTemplate<unsigned_char> local_58;
  
  local_88 = CONCAT44(in_register_00000084,startXOut);
  local_90 = CONCAT44(in_register_00000034,startXIn);
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_58,out);
  VerifyRGBImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,&local_58);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_58);
  local_94 = width * 3;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_80,out);
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (&local_94,&height,in,&local_80);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_80);
  uVar1 = out->_rowSize;
  uVar2 = in->_rowSize;
  puVar4 = out->_data + (ulong)(uint)((int)local_88 * 3) + (ulong)(startYOut * uVar1);
  puVar3 = in->_data + (ulong)(uint)((int)local_90 * 3) + (ulong)(startYIn * uVar2);
  puVar5 = puVar4 + height * uVar1;
  for (; puVar4 != puVar5; puVar4 = puVar4 + uVar1) {
    puVar7 = puVar4;
    for (uVar6 = 0; local_94 != uVar6; uVar6 = uVar6 + 3) {
      puVar7[2] = puVar3[uVar6];
      puVar7[1] = puVar3[uVar6 + 1];
      *puVar7 = puVar3[uVar6 + 2];
      puVar7 = puVar7 + 3;
    }
    puVar3 = puVar3 + uVar2;
  }
  return;
}

Assistant:

void RgbToBgr( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                   uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyRGBImage     ( in, out );

        const uint8_t colorCount = RGB;
        width = width * colorCount;

        OptimiseRoi( width, height, in, out );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn  * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX  = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; outX += colorCount, inX += colorCount ) {
                *(outX + 2) = *(inX);
                *(outX + 1) = *(inX + 1);
                *(outX) = *(inX + 2);
            }
        }
    }